

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SimInfo::getGlobalAtomIndices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SimInfo *this)

{
  pointer piVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  allocator_type local_1d;
  value_type_conflict1 local_1c;
  
  local_1c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(ulong)(uint)this->nAtoms_,&local_1c,&local_1d);
  p_Var3 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var6) &&
     (p_Var5 = p_Var3[1]._M_parent, p_Var5 != (_Base_ptr)0x0)) {
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      p_Var4 = p_Var5->_M_left;
      p_Var5 = p_Var5->_M_right;
      if (p_Var4 != p_Var5) {
        p_Var2 = *(_Base_ptr *)p_Var4;
        while (p_Var2 != (_Base_ptr)0x0) {
          p_Var4 = (_Base_ptr)&p_Var4->_M_parent;
          piVar1[*(int *)&p_Var2[1]._M_left] = *(int *)&p_Var2[1]._M_parent;
          if (p_Var4 == p_Var5) break;
          p_Var2 = *(_Base_ptr *)p_Var4;
        }
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (((_Rb_tree_header *)p_Var3 != p_Var6) &&
            (p_Var5 = p_Var3[1]._M_parent, p_Var5 != (_Base_ptr)0x0));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> SimInfo::getGlobalAtomIndices() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;

    vector<int> GlobalAtomIndices(getNAtoms(), 0);

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        GlobalAtomIndices[atom->getLocalIndex()] = atom->getGlobalIndex();
      }
    }
    return GlobalAtomIndices;
  }